

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  _func_int **pp_Var25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong *puVar30;
  undefined1 (*pauVar31) [32];
  uint uVar32;
  ulong uVar33;
  byte bVar34;
  ushort uVar35;
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  ulong local_5820 [564];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5820[3] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5820[3] != 8) {
    auVar40 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
    uVar33 = vpcmpeqd_avx512vl(auVar40,(undefined1  [32])valid_i->field_0);
    bVar34 = (byte)uVar33;
    if (bVar34 != 0) {
      auVar40 = *(undefined1 (*) [32])(ray + 0x80);
      auVar37 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar38 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42._16_4_ = 0x7fffffff;
      auVar42._20_4_ = 0x7fffffff;
      auVar42._24_4_ = 0x7fffffff;
      auVar42._28_4_ = 0x7fffffff;
      auVar39 = vandps_avx(auVar40,auVar42);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar44._16_4_ = 0x219392ef;
      auVar44._20_4_ = 0x219392ef;
      auVar44._24_4_ = 0x219392ef;
      auVar44._28_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar39,auVar44,1);
      bVar4 = (bool)((byte)uVar24 & 1);
      auVar39._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._24_4_;
      bVar4 = SUB81(uVar24 >> 7,0);
      auVar39._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar40._28_4_;
      auVar40 = vandps_avx(auVar37,auVar42);
      uVar24 = vcmpps_avx512vl(auVar40,auVar44,1);
      bVar4 = (bool)((byte)uVar24 & 1);
      auVar41._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._24_4_;
      bVar4 = SUB81(uVar24 >> 7,0);
      auVar41._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar37._28_4_;
      auVar40 = vandps_avx(auVar38,auVar42);
      uVar24 = vcmpps_avx512vl(auVar40,auVar44,1);
      bVar4 = (bool)((byte)uVar24 & 1);
      auVar40._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._0_4_;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._4_4_;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._8_4_;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._12_4_;
      bVar4 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar40._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._16_4_;
      bVar4 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar40._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._20_4_;
      bVar4 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar40._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._24_4_;
      bVar4 = SUB81(uVar24 >> 7,0);
      auVar40._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar38._28_4_;
      auVar37 = vrcp14ps_avx512vl(auVar39);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar45._16_4_ = 0x3f800000;
      auVar45._20_4_ = 0x3f800000;
      auVar45._24_4_ = 0x3f800000;
      auVar45._28_4_ = 0x3f800000;
      auVar14 = vfnmadd213ps_fma(auVar39,auVar37,auVar45);
      auVar38 = vrcp14ps_avx512vl(auVar41);
      auVar15 = vfnmadd213ps_fma(auVar41,auVar38,auVar45);
      auVar39 = vrcp14ps_avx512vl(auVar40);
      auVar16 = vfnmadd213ps_fma(auVar40,auVar39,auVar45);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar37,auVar37);
      auVar57 = ZEXT1664(auVar14);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar38,auVar38);
      auVar58 = ZEXT1664(auVar15);
      auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar39,auVar39);
      auVar59 = ZEXT1664(auVar16);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar60 = ZEXT3264(local_4680);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
      local_58e0._0_4_ = (uint)(bVar34 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000
      ;
      bVar4 = (bool)((byte)(uVar33 >> 1) & 1);
      local_58e0._4_4_ = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar33 >> 2) & 1);
      local_58e0._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar33 >> 3) & 1);
      local_58e0._12_4_ = (uint)bVar4 * auVar40._12_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar33 >> 4) & 1);
      local_58e0._16_4_ = (uint)bVar4 * auVar40._16_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar33 >> 5) & 1);
      local_58e0._20_4_ = (uint)bVar4 * auVar40._20_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = (bool)((byte)(uVar33 >> 6) & 1);
      local_58e0._24_4_ = (uint)bVar4 * auVar40._24_4_ | (uint)!bVar4 * 0x7f800000;
      bVar4 = SUB81(uVar33 >> 7,0);
      local_58e0._28_4_ = (uint)bVar4 * auVar40._28_4_ | (uint)!bVar4 * 0x7f800000;
      auVar61 = ZEXT3264(local_58e0);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar37 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
      bVar4 = (bool)((byte)(uVar33 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar33 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar33 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar33 >> 6) & 1);
      bVar10 = SUB81(uVar33 >> 7,0);
      auVar62 = ZEXT3264(CONCAT428((uint)bVar10 * auVar37._28_4_ | (uint)!bVar10 * auVar40._28_4_,
                                   CONCAT424((uint)bVar9 * auVar37._24_4_ |
                                             (uint)!bVar9 * auVar40._24_4_,
                                             CONCAT420((uint)bVar8 * auVar37._20_4_ |
                                                       (uint)!bVar8 * auVar40._20_4_,
                                                       CONCAT416((uint)bVar7 * auVar37._16_4_ |
                                                                 (uint)!bVar7 * auVar40._16_4_,
                                                                 CONCAT412((uint)bVar6 *
                                                                           auVar37._12_4_ |
                                                                           (uint)!bVar6 *
                                                                           auVar40._12_4_,
                                                                           CONCAT48((uint)bVar5 *
                                                                                    auVar37._8_4_ |
                                                                                    (uint)!bVar5 *
                                                                                    auVar40._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar4 * auVar37._4_4_ |
                                                  (uint)!bVar4 * auVar40._4_4_,
                                                  (uint)(bVar34 & 1) * auVar37._0_4_ |
                                                  (uint)!(bool)(bVar34 & 1) * auVar40._0_4_))))))));
      puVar30 = local_5820 + 4;
      auVar40 = *(undefined1 (*) [32])ray;
      auVar38._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar38._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar38._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar38._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar38._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar38._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar38._28_4_ = auVar40._28_4_ ^ 0x80000000;
      pauVar31 = (undefined1 (*) [32])local_4640;
      local_5880 = ZEXT1632(auVar14);
      local_5900 = vmulps_avx512vl(local_5880,auVar38);
      auVar63 = ZEXT3264(local_5900);
      auVar40 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar43._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar43._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar43._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar43._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar43._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar43._28_4_ = auVar40._28_4_ ^ 0x80000000;
      auVar40 = *(undefined1 (*) [32])(ray + 0x40);
      auVar37._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar37._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar37._16_4_ = auVar40._16_4_ ^ 0x80000000;
      auVar37._20_4_ = auVar40._20_4_ ^ 0x80000000;
      auVar37._24_4_ = auVar40._24_4_ ^ 0x80000000;
      auVar37._28_4_ = auVar40._28_4_ ^ 0x80000000;
      local_58a0 = ZEXT1632(auVar15);
      local_5920 = vmulps_avx512vl(local_58a0,auVar43);
      auVar64 = ZEXT3264(local_5920);
      local_58c0 = ZEXT1632(auVar16);
      local_5940 = vmulps_avx512vl(local_58c0,auVar37);
      auVar65 = ZEXT3264(local_5940);
      local_5820[2] = 0xfffffffffffffff8;
      local_4660 = local_58e0;
LAB_01de9234:
      uVar33 = puVar30[-1];
      if (uVar33 != 0xfffffffffffffff8) {
        puVar30 = puVar30 + -1;
        pauVar1 = pauVar31 + -1;
        auVar49 = ZEXT3264(*pauVar1);
        pauVar31 = pauVar31 + -1;
        local_5860 = auVar62._0_32_;
        uVar12 = vcmpps_avx512vl(*pauVar1,local_5860,1);
        if ((char)uVar12 != '\0') {
          while( true ) {
            uVar32 = (uint)uVar33;
            if ((uVar33 & 8) != 0) break;
            uVar29 = uVar33 & 0xfffffffffffffff0;
            auVar50 = ZEXT3264(auVar60._0_32_);
            uVar24 = 0;
            uVar33 = 8;
            for (lVar26 = -0x20;
                (auVar40 = auVar50._0_32_, lVar26 != 0 &&
                (uVar27 = *(ulong *)(uVar29 + 0x40 + lVar26 * 2), uVar27 != 8)); lVar26 = lVar26 + 4
                ) {
              uVar2 = *(undefined4 *)(uVar29 + 0x120 + lVar26);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              auVar51._16_4_ = uVar2;
              auVar51._20_4_ = uVar2;
              auVar51._24_4_ = uVar2;
              auVar51._28_4_ = uVar2;
              auVar37 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar2 = *(undefined4 *)(uVar29 + 0x60 + lVar26);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar47._16_4_ = uVar2;
              auVar47._20_4_ = uVar2;
              auVar47._24_4_ = uVar2;
              auVar47._28_4_ = uVar2;
              auVar38 = vfmadd213ps_avx512vl(auVar51,auVar37,auVar47);
              uVar2 = *(undefined4 *)(uVar29 + 0x160 + lVar26);
              auVar52._4_4_ = uVar2;
              auVar52._0_4_ = uVar2;
              auVar52._8_4_ = uVar2;
              auVar52._12_4_ = uVar2;
              auVar52._16_4_ = uVar2;
              auVar52._20_4_ = uVar2;
              auVar52._24_4_ = uVar2;
              auVar52._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar29 + 0xa0 + lVar26);
              auVar17._4_4_ = uVar2;
              auVar17._0_4_ = uVar2;
              auVar17._8_4_ = uVar2;
              auVar17._12_4_ = uVar2;
              auVar17._16_4_ = uVar2;
              auVar17._20_4_ = uVar2;
              auVar17._24_4_ = uVar2;
              auVar17._28_4_ = uVar2;
              auVar39 = vfmadd213ps_avx512vl(auVar52,auVar37,auVar17);
              uVar2 = *(undefined4 *)(uVar29 + 0x1a0 + lVar26);
              auVar53._4_4_ = uVar2;
              auVar53._0_4_ = uVar2;
              auVar53._8_4_ = uVar2;
              auVar53._12_4_ = uVar2;
              auVar53._16_4_ = uVar2;
              auVar53._20_4_ = uVar2;
              auVar53._24_4_ = uVar2;
              auVar53._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar29 + 0xe0 + lVar26);
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar18._16_4_ = uVar2;
              auVar18._20_4_ = uVar2;
              auVar18._24_4_ = uVar2;
              auVar18._28_4_ = uVar2;
              auVar41 = vfmadd213ps_avx512vl(auVar53,auVar37,auVar18);
              uVar2 = *(undefined4 *)(uVar29 + 0x140 + lVar26);
              auVar54._4_4_ = uVar2;
              auVar54._0_4_ = uVar2;
              auVar54._8_4_ = uVar2;
              auVar54._12_4_ = uVar2;
              auVar54._16_4_ = uVar2;
              auVar54._20_4_ = uVar2;
              auVar54._24_4_ = uVar2;
              auVar54._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar29 + 0x80 + lVar26);
              auVar19._4_4_ = uVar2;
              auVar19._0_4_ = uVar2;
              auVar19._8_4_ = uVar2;
              auVar19._12_4_ = uVar2;
              auVar19._16_4_ = uVar2;
              auVar19._20_4_ = uVar2;
              auVar19._24_4_ = uVar2;
              auVar19._28_4_ = uVar2;
              auVar42 = vfmadd213ps_avx512vl(auVar54,auVar37,auVar19);
              uVar2 = *(undefined4 *)(uVar29 + 0x180 + lVar26);
              auVar55._4_4_ = uVar2;
              auVar55._0_4_ = uVar2;
              auVar55._8_4_ = uVar2;
              auVar55._12_4_ = uVar2;
              auVar55._16_4_ = uVar2;
              auVar55._20_4_ = uVar2;
              auVar55._24_4_ = uVar2;
              auVar55._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar29 + 0xc0 + lVar26);
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar20._16_4_ = uVar2;
              auVar20._20_4_ = uVar2;
              auVar20._24_4_ = uVar2;
              auVar20._28_4_ = uVar2;
              auVar43 = vfmadd213ps_avx512vl(auVar55,auVar37,auVar20);
              uVar2 = *(undefined4 *)(uVar29 + 0x1c0 + lVar26);
              auVar56._4_4_ = uVar2;
              auVar56._0_4_ = uVar2;
              auVar56._8_4_ = uVar2;
              auVar56._12_4_ = uVar2;
              auVar56._16_4_ = uVar2;
              auVar56._20_4_ = uVar2;
              auVar56._24_4_ = uVar2;
              auVar56._28_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar29 + 0x100 + lVar26);
              auVar21._4_4_ = uVar2;
              auVar21._0_4_ = uVar2;
              auVar21._8_4_ = uVar2;
              auVar21._12_4_ = uVar2;
              auVar21._16_4_ = uVar2;
              auVar21._20_4_ = uVar2;
              auVar21._24_4_ = uVar2;
              auVar21._28_4_ = uVar2;
              auVar44 = vfmadd213ps_avx512vl(auVar56,auVar37,auVar21);
              auVar45 = vfmadd213ps_avx512vl(auVar38,auVar57._0_32_,auVar63._0_32_);
              auVar46 = vfmadd213ps_avx512vl(auVar39,auVar58._0_32_,auVar64._0_32_);
              auVar47 = vfmadd213ps_avx512vl(auVar41,auVar59._0_32_,auVar65._0_32_);
              auVar41 = vfmadd213ps_avx512vl(auVar42,auVar57._0_32_,auVar63._0_32_);
              auVar42 = vfmadd213ps_avx512vl(auVar43,auVar58._0_32_,auVar64._0_32_);
              auVar43 = vfmadd213ps_avx512vl(auVar44,auVar59._0_32_,auVar65._0_32_);
              auVar38 = vpminsd_avx2(auVar45,auVar41);
              auVar39 = vpminsd_avx2(auVar46,auVar42);
              auVar38 = vpmaxsd_avx2(auVar38,auVar39);
              auVar39 = vpminsd_avx2(auVar47,auVar43);
              auVar38 = vpmaxsd_avx2(auVar38,auVar39);
              auVar39 = vpmaxsd_avx2(auVar45,auVar41);
              auVar41 = vpmaxsd_avx2(auVar46,auVar42);
              auVar42 = vpminsd_avx2(auVar39,auVar41);
              auVar39 = vpmaxsd_avx2(auVar47,auVar43);
              auVar41 = vpmaxsd_avx2(auVar38,auVar61._0_32_);
              auVar39 = vpminsd_avx512vl(auVar39,local_5860);
              auVar39 = vpminsd_avx2(auVar42,auVar39);
              uVar36 = vcmpps_avx512vl(auVar41,auVar39,2);
              if ((uVar32 & 7) == 6) {
                uVar2 = *(undefined4 *)(uVar29 + 0x1e0 + lVar26);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar22._16_4_ = uVar2;
                auVar22._20_4_ = uVar2;
                auVar22._24_4_ = uVar2;
                auVar22._28_4_ = uVar2;
                uVar28 = vcmpps_avx512vl(auVar37,auVar22,0xd);
                uVar2 = *(undefined4 *)(uVar29 + 0x200 + lVar26);
                auVar23._4_4_ = uVar2;
                auVar23._0_4_ = uVar2;
                auVar23._8_4_ = uVar2;
                auVar23._12_4_ = uVar2;
                auVar23._16_4_ = uVar2;
                auVar23._20_4_ = uVar2;
                auVar23._24_4_ = uVar2;
                auVar23._28_4_ = uVar2;
                uVar13 = vcmpps_avx512vl(auVar37,auVar23,1);
                uVar36 = uVar36 & uVar28 & uVar13;
              }
              uVar28 = vcmpps_avx512vl(local_5860,auVar49._0_32_,6);
              uVar36 = uVar36 & uVar28;
              if ((byte)uVar36 != 0) {
                auVar38 = vblendmps_avx512vl(auVar60._0_32_,auVar38);
                bVar4 = (bool)((byte)uVar36 & 1);
                auVar48._0_4_ = (uint)bVar4 * auVar38._0_4_ | (uint)!bVar4 * auVar37._0_4_;
                bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar4 * auVar38._4_4_ | (uint)!bVar4 * auVar37._4_4_;
                bVar4 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * auVar37._8_4_;
                bVar4 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar48._12_4_ = (uint)bVar4 * auVar38._12_4_ | (uint)!bVar4 * auVar37._12_4_;
                bVar4 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar48._16_4_ = (uint)bVar4 * auVar38._16_4_ | (uint)!bVar4 * auVar37._16_4_;
                bVar4 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar48._20_4_ = (uint)bVar4 * auVar38._20_4_ | (uint)!bVar4 * auVar37._20_4_;
                bVar4 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar48._24_4_ = (uint)bVar4 * auVar38._24_4_ | (uint)!bVar4 * auVar37._24_4_;
                bVar4 = SUB81(uVar36 >> 7,0);
                auVar48._28_4_ = (uint)bVar4 * auVar38._28_4_ | (uint)!bVar4 * auVar37._28_4_;
                uVar12 = vcmpps_avx512vl(auVar48,auVar40,1);
                uVar36 = uVar33;
                uVar28 = uVar27;
                auVar37 = auVar48;
                if (((char)uVar12 == '\0') ||
                   (uVar36 = uVar27, uVar28 = uVar33, auVar37 = auVar40, auVar40 = auVar48,
                   uVar33 != 8)) {
                  auVar48 = auVar40;
                  uVar24 = uVar24 + 1;
                  *puVar30 = uVar28;
                  puVar30 = puVar30 + 1;
                  *pauVar31 = auVar37;
                  pauVar31 = pauVar31 + 1;
                  uVar27 = uVar36;
                }
                auVar50 = ZEXT3264(auVar48);
                uVar33 = uVar27;
              }
            }
            if (uVar33 == 8) goto LAB_01de9234;
            auVar49 = ZEXT3264(auVar40);
            if (1 < uVar24) {
              auVar38 = pauVar31[-2];
              auVar37 = pauVar31[-1];
              uVar12 = vcmpps_avx512vl(auVar38,auVar37,1);
              auVar39 = auVar37;
              if ((char)uVar12 != '\0') {
                pauVar31[-2] = auVar37;
                pauVar31[-1] = auVar38;
                auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar30 + -2),0x4e);
                *(undefined1 (*) [16])(puVar30 + -2) = auVar14;
                auVar39 = auVar38;
                auVar38 = auVar37;
              }
              auVar49 = ZEXT3264(auVar40);
              if (uVar24 != 2) {
                auVar37 = pauVar31[-3];
                uVar12 = vcmpps_avx512vl(auVar37,auVar39,1);
                if ((char)uVar12 != '\0') {
                  pauVar31[-3] = auVar39;
                  pauVar31[-1] = auVar37;
                  uVar24 = puVar30[-3];
                  puVar30[-3] = puVar30[-1];
                  puVar30[-1] = uVar24;
                  auVar37 = auVar39;
                }
                uVar12 = vcmpps_avx512vl(auVar37,auVar38,1);
                auVar49 = ZEXT3264(auVar40);
                if ((char)uVar12 != '\0') {
                  pauVar31[-3] = auVar38;
                  pauVar31[-2] = auVar37;
                  auVar14 = vpermilps_avx(*(undefined1 (*) [16])(puVar30 + -3),0x4e);
                  *(undefined1 (*) [16])(puVar30 + -3) = auVar14;
                  auVar49 = ZEXT3264(auVar40);
                }
              }
            }
          }
          if (uVar33 == 0xfffffffffffffff8) {
            return;
          }
          uVar24 = vcmpps_avx512vl(local_5860,auVar49._0_32_,6);
          uVar35 = (ushort)uVar24;
          if ((byte)uVar24 != 0) {
            for (lVar26 = 0; (ulong)(uVar32 & 0xf) - 8 != lVar26; lVar26 = lVar26 + 1) {
              local_5988.geomID = *(uint *)((uVar33 & 0xfffffffffffffff0) + lVar26 * 8);
              local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
              uVar3 = local_5958->mask;
              auVar46._4_4_ = uVar3;
              auVar46._0_4_ = uVar3;
              auVar46._8_4_ = uVar3;
              auVar46._12_4_ = uVar3;
              auVar46._16_4_ = uVar3;
              auVar46._20_4_ = uVar3;
              auVar46._24_4_ = uVar3;
              auVar46._28_4_ = uVar3;
              uVar29 = vptestmd_avx512vl(auVar46,*(undefined1 (*) [32])(ray + 0x120));
              uVar29 = uVar24 & 0xff & uVar29;
              if ((char)uVar29 != '\0') {
                local_5988.primID = *(uint *)((uVar33 & 0xfffffffffffffff0) + 4 + lVar26 * 8);
                local_5840 = vpmovm2d_avx512vl(uVar29);
                local_5988.valid = (int *)local_5840;
                local_5988.geometryUserPtr = local_5958->userPtr;
                local_5988.context = context->user;
                local_5988.N = 8;
                local_5950 = 0;
                local_5948 = context->args;
                pp_Var25 = (_func_int **)local_5948->intersect;
                if (pp_Var25 == (_func_int **)0x0) {
                  pp_Var25 = local_5958[1].super_RefCount._vptr_RefCount;
                }
                local_5988.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var25)(&local_5988);
                auVar57 = ZEXT3264(local_5880);
                auVar58 = ZEXT3264(local_58a0);
                auVar59 = ZEXT3264(local_58c0);
                auVar60 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar61 = ZEXT3264(local_58e0);
                auVar62 = ZEXT3264(local_5860);
                auVar63 = ZEXT3264(local_5900);
                auVar64 = ZEXT3264(local_5920);
                auVar65 = ZEXT3264(local_5940);
              }
            }
            bVar4 = (bool)((byte)uVar24 & 1);
            bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar35 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar35 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar35 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
            bVar11 = (bool)((byte)(uVar35 >> 7) & 1);
            auVar62 = ZEXT3264(CONCAT428((uint)bVar11 * *(int *)(ray + 0x11c) |
                                         (uint)!bVar11 * auVar62._28_4_,
                                         CONCAT424((uint)bVar10 * *(int *)(ray + 0x118) |
                                                   (uint)!bVar10 * auVar62._24_4_,
                                                   CONCAT420((uint)bVar9 * *(int *)(ray + 0x114) |
                                                             (uint)!bVar9 * auVar62._20_4_,
                                                             CONCAT416((uint)bVar8 *
                                                                       *(int *)(ray + 0x110) |
                                                                       (uint)!bVar8 * auVar62._16_4_
                                                                       ,CONCAT412((uint)bVar7 *
                                                                                  *(int *)(ray + 
                                                  0x10c) | (uint)!bVar7 * auVar62._12_4_,
                                                  CONCAT48((uint)bVar6 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar6 * auVar62._8_4_,
                                                           CONCAT44((uint)bVar5 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar5 * auVar62._4_4_,
                                                                    (uint)bVar4 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar4 * auVar62._0_4_))))
                                                  ))));
          }
        }
        goto LAB_01de9234;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }